

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  uint uVar13;
  long lVar14;
  byte bVar15;
  bool bVar16;
  
  if (end <= ptr) {
    return -4;
  }
  uVar10 = (long)end - (long)ptr & 0xfffffffffffffffe;
  pcVar6 = ptr + uVar10;
  if (uVar10 == 0) {
    pcVar6 = end;
  }
  bVar16 = ((long)end - (long)ptr & 1U) != 0;
  if (!bVar16) {
    pcVar6 = end;
  }
  if (bVar16 && uVar10 == 0) {
    return -1;
  }
  bVar1 = *ptr;
  if (0xdb < bVar1) {
    if ((bVar1 - 0xdc < 4) || ((bVar1 == 0xff && (0xfd < (byte)ptr[1])))) {
switchD_005f5f57_caseD_0:
      *nextTokPtr = ptr;
      return 0;
    }
    goto switchD_005f5f57_default;
  }
  if (bVar1 - 0xd8 < 4) {
switchD_005f5f57_caseD_7:
    if ((long)pcVar6 - (long)ptr < 4) {
      return -2;
    }
    pbVar8 = (byte *)(ptr + 4);
    goto joined_r0x005f5fc8;
  }
  if (bVar1 != 0) goto switchD_005f5f57_default;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[1])) {
  case 0:
  case 1:
  case 8:
    goto switchD_005f5f57_caseD_0;
  case 2:
    pbVar9 = (byte *)(ptr + 2);
    uVar10 = (long)pcVar6 - (long)pbVar9;
    if ((long)uVar10 < 2) {
      return -1;
    }
    bVar1 = *pbVar9;
    if (bVar1 < 0xdc) {
      if (bVar1 - 0xd8 < 4) {
switchD_005f61e2_caseD_7:
        if (uVar10 < 4) {
          return -2;
        }
        goto switchD_005f61e2_caseD_5;
      }
      if (bVar1 != 0) {
LAB_005f620b:
        uVar13 = (uint)(byte)ptr[3];
        goto LAB_005f620f;
      }
      uVar13 = (uint)(byte)ptr[3];
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)ptr[3]);
      switch(cVar2) {
      case '\x05':
      case '\b':
      case '\t':
      case '\n':
      case '\v':
      case '\f':
      case '\r':
      case '\x0e':
      case '\x12':
      case '\x13':
      case '\x14':
      case '\x15':
      case '\x17':
        break;
      case '\x06':
        if (uVar10 == 2) {
          return -2;
        }
        break;
      case '\a':
        goto switchD_005f61e2_caseD_7;
      case '\x0f':
        iVar5 = big2_scanPi(enc,ptr + 4,pcVar6,nextTokPtr);
        return iVar5;
      case '\x10':
        pbVar9 = (byte *)(ptr + 4);
        if ((long)pcVar6 - (long)pbVar9 < 2) {
          return -1;
        }
        if (*pbVar9 == 0) {
          cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)ptr[5]);
          if (cVar2 == '\x14') {
            pcVar12 = ptr + 6;
            if ((long)pcVar6 - (long)pcVar12 < 0xc) {
              return -1;
            }
            iVar5 = 0;
            lVar14 = 0;
            do {
              if ((*pcVar12 != '\0') || (pcVar12[1] != (&big2_scanCdataSection_CDATA_LSQB)[lVar14]))
              goto LAB_005f673c;
              lVar14 = lVar14 + 1;
              pcVar12 = pcVar12 + 2;
            } while (lVar14 != 6);
            iVar5 = 8;
            pcVar12 = ptr + 0x12;
LAB_005f673c:
            *nextTokPtr = pcVar12;
            return iVar5;
          }
          if (cVar2 == '\x1b') {
            iVar5 = big2_scanComment(enc,ptr + 6,pcVar6,nextTokPtr);
            return iVar5;
          }
        }
        break;
      case '\x11':
        pbVar8 = (byte *)(ptr + 4);
        uVar10 = (long)pcVar6 - (long)pbVar8;
        if ((long)uVar10 < 2) {
          return -1;
        }
        bVar1 = *pbVar8;
        iVar5 = 0;
        if (bVar1 < 0xdc) {
          if (3 < bVar1 - 0xd8) {
            if (bVar1 != 0) {
LAB_005f65f7:
              bVar15 = ptr[5];
              goto LAB_005f65fa;
            }
            bVar15 = ptr[5];
            bVar3 = *(byte *)((long)enc[1].scanners + (ulong)bVar15);
            if (0x15 < bVar3) {
              if ((bVar3 == 0x16) || (bVar3 == 0x18)) goto LAB_005f662f;
              if (bVar3 != 0x1d) goto LAB_005f6423;
              goto LAB_005f65fa;
            }
            if (bVar3 == 6) {
              if (uVar10 == 2) {
                return -2;
              }
              goto LAB_005f6423;
            }
            if (bVar3 != 7) goto LAB_005f6423;
          }
          iVar5 = 0;
          if (uVar10 < 4) {
            return -2;
          }
        }
        else {
          if (bVar1 - 0xdc < 4) goto LAB_005f6423;
          if (bVar1 != 0xff) goto LAB_005f65f7;
          bVar15 = ptr[5];
          if (0xfd < bVar15) goto LAB_005f6423;
LAB_005f65fa:
          if ((*(uint *)((long)namingBitmap +
                        (ulong)(bVar15 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5))
               >> (bVar15 & 0x1f) & 1) != 0) {
LAB_005f662f:
            if ((long)(pcVar6 + (-6 - (long)ptr)) < 2) {
              return -1;
            }
            lVar11 = 7;
            lVar14 = 0;
LAB_005f665e:
            bVar1 = ptr[lVar11 + -1];
            if (0xdb < bVar1) {
              if (bVar1 == 0xff) {
                uVar13 = (uint)(byte)ptr[lVar11];
                if ((byte)ptr[lVar11] < 0xfe) goto switchD_005f6695_caseD_1d;
              }
              else if (3 < bVar1 - 0xdc) goto LAB_005f66d1;
              goto switchD_005f6695_caseD_8;
            }
            if (bVar1 != 0) {
              if (3 < bVar1 - 0xd8) {
LAB_005f66d1:
                uVar13 = (uint)(byte)ptr[lVar11];
                goto switchD_005f6695_caseD_1d;
              }
switchD_005f6695_caseD_7:
              if (pcVar6 + (lVar14 - (long)ptr) + -6 < (char *)0x4) {
                return -2;
              }
              goto switchD_005f6695_caseD_8;
            }
            uVar13 = (uint)(byte)ptr[lVar11];
            switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[lVar11])) {
            case 6:
              if (pcVar6 + (lVar14 - (long)ptr) == (char *)0x8) {
                return -2;
              }
              break;
            case 7:
              goto switchD_005f6695_caseD_7;
            case 9:
            case 10:
            case 0x15:
              pcVar6 = pcVar6 + (lVar14 - (long)ptr) + -8;
              if ((long)pcVar6 < 2) {
                return -1;
              }
              pbVar8 = (byte *)(ptr + (8 - lVar14));
              goto LAB_005f681f;
            case 0xb:
              pbVar8 = (byte *)(ptr + (8 - lVar14));
              iVar5 = 5;
              goto LAB_005f6423;
            case 0x16:
            case 0x18:
            case 0x19:
            case 0x1a:
            case 0x1b:
              goto switchD_005f6695_caseD_16;
            case 0x1d:
switchD_005f6695_caseD_1d:
              if ((*(uint *)((long)namingBitmap +
                            (ulong)(uVar13 >> 3 & 0x1c |
                                   (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
                   (uVar13 & 0x1f) & 1) != 0) goto switchD_005f6695_caseD_16;
            }
switchD_005f6695_caseD_8:
            pbVar8 = (byte *)(ptr + (6 - lVar14));
            iVar5 = 0;
          }
        }
LAB_005f6423:
        *nextTokPtr = (char *)pbVar8;
        return iVar5;
      case '\x16':
      case '\x18':
        goto switchD_005f61e2_caseD_16;
      default:
        if (cVar2 != '\x1d') break;
        goto LAB_005f620f;
      }
switchD_005f61e2_caseD_5:
      *nextTokPtr = (char *)pbVar9;
      return 0;
    }
    if (bVar1 - 0xdc < 4) goto switchD_005f61e2_caseD_5;
    if (bVar1 != 0xff) goto LAB_005f620b;
    uVar13 = (uint)(byte)ptr[3];
    if (0xfd < (byte)ptr[3]) goto switchD_005f61e2_caseD_5;
LAB_005f620f:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(uVar13 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
         (uVar13 & 0x1f) & 1) == 0) goto switchD_005f61e2_caseD_5;
switchD_005f61e2_caseD_16:
    if ((long)(pcVar6 + (-4 - (long)ptr)) < 2) {
      return -1;
    }
    lVar14 = -4;
    pcVar12 = (char *)0x0;
    while( true ) {
      bVar1 = ptr[(long)(pcVar12 + 4)];
      if (bVar1 < 0xdc) break;
      if (bVar1 == 0xff) {
        bVar15 = ptr[(long)(pcVar12 + 5)];
        if (0xfd < bVar15) goto switchD_005f62b2_caseD_5;
      }
      else {
        if (bVar1 - 0xdc < 4) goto switchD_005f62b2_caseD_5;
LAB_005f62e5:
        bVar15 = ptr[(long)(pcVar12 + 5)];
      }
switchD_005f62b2_caseD_1d:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)(bVar15 >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5))
           >> (bVar15 & 0x1f) & 1) == 0) goto switchD_005f62b2_caseD_5;
switchD_005f62b2_caseD_16:
      pcVar12 = pcVar12 + 2;
      lVar11 = lVar14 - (long)ptr;
      lVar14 = lVar14 + -2;
      if ((long)(pcVar6 + lVar11 + -2) < 2) {
        return -1;
      }
    }
    if (bVar1 == 0) {
      bVar15 = ptr[(long)(pcVar12 + 5)];
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)bVar15)) {
      case 6:
        if (pcVar6 + (-6 - (long)ptr) == pcVar12) {
          return -2;
        }
        break;
      case 7:
        goto switchD_005f62b2_caseD_7;
      case 9:
      case 10:
      case 0x15:
        if ((long)(pcVar6 + (-(long)pcVar12 - (long)ptr) + -6) < 2) {
          return -1;
        }
        pcVar7 = ptr + (long)(pcVar12 + 8);
        pcVar12 = pcVar6 + (-(long)pcVar12 - (long)ptr) + -8;
LAB_005f6451:
        bVar1 = pcVar7[-2];
        uVar10 = (ulong)bVar1;
        if (bVar1 != 0) {
          if (bVar1 - 0xd8 < 4) goto switchD_005f6482_caseD_7;
          if (3 < bVar1 - 0xdc) {
            if (bVar1 == 0xff) {
              uVar13 = (uint)(byte)pcVar7[-1];
              uVar10 = 0xff;
              if (0xfd < (byte)pcVar7[-1]) goto switchD_005f6482_caseD_5;
            }
            else {
              uVar13 = (uint)(byte)pcVar7[-1];
            }
LAB_005f67b4:
            if ((*(uint *)((long)namingBitmap +
                          (ulong)(uVar13 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[uVar10] << 5
                                 )) >> (uVar13 & 0x1f) & 1) != 0) {
switchD_005f6482_caseD_16:
              iVar5 = big2_scanAtts(enc,pcVar7,pcVar6,nextTokPtr);
              return iVar5;
            }
          }
          goto switchD_005f6482_caseD_5;
        }
        uVar13 = (uint)(byte)pcVar7[-1];
        switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)pcVar7[-1])) {
        case 6:
          if (pcVar12 == (char *)0x0) {
            return -2;
          }
          break;
        case 7:
switchD_005f6482_caseD_7:
          if (pcVar12 + 2 < (char *)0x4) {
            return -2;
          }
          break;
        case 9:
        case 10:
        case 0x15:
          goto switchD_005f6482_caseD_9;
        case 0xb:
          pcVar7 = pcVar7 + -2;
          goto LAB_005f6593;
        case 0x11:
          pcVar7 = pcVar7 + -2;
          goto LAB_005f65ab;
        case 0x16:
        case 0x18:
          goto switchD_005f6482_caseD_16;
        case 0x1d:
          uVar10 = 0;
          goto LAB_005f67b4;
        }
switchD_005f6482_caseD_5:
        ptr = pcVar7 + -2;
        goto switchD_005f5f57_caseD_0;
      case 0xb:
        pcVar7 = ptr + (long)(pcVar12 + 4);
LAB_005f6593:
        *nextTokPtr = pcVar7 + 2;
        return 2;
      case 0x11:
        pcVar7 = ptr + (long)(pcVar12 + 4);
LAB_005f65ab:
        pcVar12 = pcVar7 + 2;
        if ((long)pcVar6 - (long)pcVar12 < 2) {
          return -1;
        }
        if ((*pcVar12 == '\0') && (pcVar7[3] == '>')) {
          *nextTokPtr = pcVar7 + 4;
          return 4;
        }
        *nextTokPtr = pcVar12;
        return 0;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_005f62b2_caseD_16;
      case 0x1d:
        goto switchD_005f62b2_caseD_1d;
      }
    }
    else {
      if (3 < bVar1 - 0xd8) goto LAB_005f62e5;
switchD_005f62b2_caseD_7:
      if (pcVar6 + (lVar14 - (long)ptr) < (char *)0x4) {
        return -2;
      }
    }
switchD_005f62b2_caseD_5:
    *nextTokPtr = ptr + (long)(pcVar12 + 4);
    return 0;
  case 3:
    iVar5 = big2_scanRef(enc,ptr + 2,pcVar6,nextTokPtr);
    return iVar5;
  case 4:
    pbVar8 = (byte *)(ptr + 2);
    if ((long)pcVar6 - (long)pbVar8 < 2) {
      return -5;
    }
    if ((*pbVar8 == 0) && (ptr[3] == ']')) {
      pcVar12 = ptr + 4;
      if ((long)pcVar6 - (long)pcVar12 < 2) {
        return -5;
      }
      if ((*pcVar12 == '\0') && (ptr[5] == '>')) {
        *nextTokPtr = pcVar12;
        return 0;
      }
    }
    break;
  case 5:
    if ((long)pcVar6 - (long)ptr < 2) {
      return -2;
    }
  default:
switchD_005f5f57_default:
    pbVar8 = (byte *)(ptr + 2);
    break;
  case 6:
    if ((long)pcVar6 - (long)ptr < 3) {
      return -2;
    }
    pbVar8 = (byte *)(ptr + 3);
    break;
  case 7:
    goto switchD_005f5f57_caseD_7;
  case 9:
    pcVar12 = ptr + 2;
    if (1 < (long)pcVar6 - (long)pcVar12) {
      if ((*pcVar12 == '\0') && (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[3]) == '\n')) {
        pcVar12 = ptr + 4;
      }
      *nextTokPtr = pcVar12;
      return 7;
    }
    return -3;
  case 10:
    *nextTokPtr = ptr + 2;
    return 7;
  }
joined_r0x005f5fc8:
  do {
    while( true ) {
      pbVar9 = pbVar8;
      uVar10 = (long)pcVar6 - (long)pbVar9;
      if ((long)uVar10 < 2) {
        *nextTokPtr = (char *)pbVar9;
        return 6;
      }
      bVar1 = *pbVar9;
      if (0xdb < bVar1) {
        if (bVar1 == 0xff) {
          if (0xfd < pbVar9[1]) goto switchD_005f6034_caseD_0;
        }
        else if (bVar1 - 0xdc < 4) goto switchD_005f6034_caseD_0;
        goto switchD_005f6034_caseD_5;
      }
      if (3 < bVar1 - 0xd8) break;
switchD_005f6034_caseD_7:
      if (uVar10 < 4) goto switchD_005f6034_caseD_0;
      pbVar8 = pbVar9 + 4;
    }
    if (bVar1 == 0) {
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)pbVar9[1])) {
      case 4:
        goto switchD_005f6034_caseD_4;
      default:
        break;
      case 6:
        if (uVar10 != 2) {
          pbVar8 = pbVar9 + 3;
          goto joined_r0x005f5fc8;
        }
      case 0:
      case 1:
      case 2:
      case 3:
      case 8:
      case 9:
      case 10:
switchD_005f6034_caseD_0:
        *nextTokPtr = (char *)pbVar9;
        return 6;
      case 7:
        goto switchD_005f6034_caseD_7;
      }
    }
switchD_005f6034_caseD_5:
    pbVar8 = pbVar9 + 2;
  } while( true );
switchD_005f6034_caseD_4:
  if (uVar10 < 4) goto switchD_005f6034_caseD_0;
  pbVar8 = pbVar9 + 2;
  if ((pbVar9[2] != 0) || (pbVar9[3] != 0x5d)) goto joined_r0x005f5fc8;
  if (uVar10 < 6) goto switchD_005f6034_caseD_0;
  if ((pbVar9[4] != 0) || (pbVar9[5] != 0x3e)) goto joined_r0x005f5fc8;
  pbVar9 = pbVar9 + 4;
  goto switchD_005f61e2_caseD_5;
switchD_005f6482_caseD_9:
  pcVar7 = pcVar7 + 2;
  bVar16 = (long)pcVar12 < 2;
  pcVar12 = pcVar12 + -2;
  if (bVar16) {
    return -1;
  }
  goto LAB_005f6451;
switchD_005f6695_caseD_16:
  lVar4 = lVar14 - (long)ptr;
  lVar14 = lVar14 + -2;
  lVar11 = lVar11 + 2;
  if ((long)(pcVar6 + lVar4 + -8) < 2) {
    return -1;
  }
  goto LAB_005f665e;
LAB_005f681f:
  iVar5 = 0;
  if (*pbVar8 != 0) goto LAB_005f6423;
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)pbVar8[1]);
  if ((1 < bVar1 - 9) && (bVar1 != 0x15)) {
    if (bVar1 == 0xb) {
      pbVar8 = pbVar8 + 2;
      iVar5 = 5;
    }
    goto LAB_005f6423;
  }
  pbVar8 = pbVar8 + 2;
  pcVar6 = pcVar6 + -2;
  if ((long)pcVar6 < 2) {
    return -1;
  }
  goto LAB_005f681f;
}

Assistant:

static int PTRCALL
PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr) {
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (! CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
    INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) {                       \
      *nextTokPtr = ptr;                                                       \
      return XML_TOK_DATA_CHARS;                                               \
    }                                                                          \
    ptr += n;                                                                  \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_RSQB:
      if (HAS_CHARS(enc, ptr, end, 2)) {
        if (! CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
          ptr += MINBPC(enc);
          break;
        }
        if (HAS_CHARS(enc, ptr, end, 3)) {
          if (! CHAR_MATCHES(enc, ptr + 2 * MINBPC(enc), ASCII_GT)) {
            ptr += MINBPC(enc);
            break;
          }
          *nextTokPtr = ptr + 2 * MINBPC(enc);
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}